

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

BOOL __thiscall
Js::TypedArrayBase::SetProperty
          (TypedArrayBase *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  charcount_t length;
  BOOL BVar3;
  char16 *str;
  undefined4 *puVar4;
  
  str = JavascriptString::GetString(propertyNameString);
  length = JavascriptString::GetLength(propertyNameString);
  bVar2 = PropertyRecord::IsPropertyNameNumeric(str,length);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x266,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord*"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  BVar3 = CanonicalNumericIndexString
                    (propertyNameString,
                     (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                         super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr);
  if (BVar3 != 0) {
    return 0;
  }
  BVar3 = DynamicObject::SetProperty((DynamicObject *)this,propertyNameString,value,flags,info);
  return BVar3;
}

Assistant:

BOOL TypedArrayBase::SetProperty(JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord*");

        ScriptContext *requestContext = GetScriptContext();
        if (CanonicalNumericIndexString(propertyNameString, requestContext))
        {
            return FALSE; // Integer-index exotic object should not set property that is canonical numeric index string but came to this overload
        }

        return DynamicObject::SetProperty(propertyNameString, value, flags, info);
    }